

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

Try<bool> * __thiscall
async_simple::coro::detail::LazyPromise<bool>::tryResult(LazyPromise<bool> *this)

{
  bool bVar1;
  bool *value;
  Try<bool> *in_RDI;
  exception_ptr *in_stack_ffffffffffffffb8;
  Try<bool> *in_stack_ffffffffffffffc0;
  Try<bool> *this_00;
  Try<bool> local_18;
  
  bVar1 = std::
          holds_alternative<std::__exception_ptr::exception_ptr,std::monostate,bool,std::__exception_ptr::exception_ptr>
                    ((variant<std::monostate,_bool,_std::__exception_ptr::exception_ptr> *)0x3e7b8e)
  ;
  if (bVar1) {
    std::
    get<std::__exception_ptr::exception_ptr,std::monostate,bool,std::__exception_ptr::exception_ptr>
              ((variant<std::monostate,_bool,_std::__exception_ptr::exception_ptr> *)0x3e7ba2);
    this_00 = &local_18;
    std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)this_00,in_stack_ffffffffffffffb8);
    Try<bool>::Try(this_00,in_stack_ffffffffffffffb8);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)this_00);
  }
  else {
    value = std::get<bool,std::monostate,bool,std::__exception_ptr::exception_ptr>
                      ((variant<std::monostate,_bool,_std::__exception_ptr::exception_ptr> *)
                       0x3e7be8);
    Try<bool>::Try<bool>(in_stack_ffffffffffffffc0,value);
  }
  return in_RDI;
}

Assistant:

Try<T> tryResult() noexcept {
        if (std::holds_alternative<std::exception_ptr>(_value))
            AS_UNLIKELY { return Try<T>(std::get<std::exception_ptr>(_value)); }